

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Type * struct_decl(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  int iVar1;
  int iVar2;
  C_Type *pCVar3;
  C_Member *pCStack_40;
  int sz;
  C_Member *mem;
  int bits;
  C_Type *ty;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  pCVar3 = struct_union_decl(parser,rest,tok);
  pCVar3->kind = TY_STRUCT;
  if (-1 < pCVar3->size) {
    mem._4_4_ = 0;
    for (pCStack_40 = pCVar3->members; pCStack_40 != (C_Member *)0x0; pCStack_40 = pCStack_40->next)
    {
      if (((pCStack_40->is_bitfield & 1U) == 0) || (pCStack_40->bit_width != 0)) {
        if ((pCStack_40->is_bitfield & 1U) == 0) {
          if ((pCVar3->is_packed & 1U) == 0) {
            mem._4_4_ = C_align_to(mem._4_4_,pCStack_40->align << 3);
          }
          pCStack_40->offset = mem._4_4_ / 8;
          mem._4_4_ = pCStack_40->ty->size * 8 + mem._4_4_;
        }
        else {
          iVar2 = pCStack_40->ty->size;
          if (mem._4_4_ / (iVar2 << 3) != (mem._4_4_ + pCStack_40->bit_width + -1) / (iVar2 << 3)) {
            mem._4_4_ = C_align_to(mem._4_4_,iVar2 << 3);
          }
          iVar1 = align_down(mem._4_4_ / 8,iVar2);
          pCStack_40->offset = iVar1;
          pCStack_40->bit_offset = mem._4_4_ % (iVar2 << 3);
          mem._4_4_ = pCStack_40->bit_width + mem._4_4_;
        }
      }
      else {
        mem._4_4_ = C_align_to(mem._4_4_,pCStack_40->ty->size << 3);
      }
      if (((pCVar3->is_packed & 1U) == 0) && (pCVar3->align < pCStack_40->align)) {
        pCVar3->align = pCStack_40->align;
      }
    }
    iVar2 = C_align_to(mem._4_4_,pCVar3->align << 3);
    pCVar3->size = iVar2 / 8;
  }
  return pCVar3;
}

Assistant:

static C_Type *struct_decl(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = struct_union_decl(parser, rest, tok);
  ty->kind = TY_STRUCT;

  if (ty->size < 0)
    return ty;

  // Assign offsets within the struct to members.
  int bits = 0;

  for (C_Member *mem = ty->members; mem; mem = mem->next) {
    if (mem->is_bitfield && mem->bit_width == 0) {
      // Zero-width anonymous bitfield has a special meaning.
      // It affects only alignment.
      bits = C_align_to(bits, mem->ty->size * 8);
    } else if (mem->is_bitfield) {
      int sz = mem->ty->size;
      if (bits / (sz * 8) != (bits + mem->bit_width - 1) / (sz * 8))
        bits = C_align_to(bits, sz * 8);

      mem->offset = align_down(bits / 8, sz);
      mem->bit_offset = bits % (sz * 8);
      bits += mem->bit_width;
    } else {
      if (!ty->is_packed)
        bits = C_align_to(bits, mem->align * 8);
      mem->offset = bits / 8;
      bits += mem->ty->size * 8;
    }

    if (!ty->is_packed && ty->align < mem->align)
      ty->align = mem->align;
  }

  ty->size = C_align_to(bits, ty->align * 8) / 8;
  return ty;
}